

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::IntegerCastOperation::HandleDigit<duckdb::IntegerCastData<unsigned_int>,false>
               (IntegerCastData<unsigned_int> *state,uint8_t digit)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  byte in_SIL;
  uint *in_RDI;
  
  uVar3 = *in_RDI;
  uVar2 = NumericLimits<unsigned_int>::Maximum();
  bVar1 = uVar3 <= (uVar2 - in_SIL) / 10;
  if (bVar1) {
    uVar3 = UnsafeNumericCast<unsigned_int,unsigned_int,void>(*in_RDI * 10 + (uint)in_SIL);
    *in_RDI = uVar3;
  }
  return bVar1;
}

Assistant:

static bool HandleDigit(T &state, uint8_t digit) {
		using store_t = typename T::StoreType;
		if (NEGATIVE) {
			if (DUCKDB_UNLIKELY(state.result < (NumericLimits<store_t>::Minimum() + digit) / 10)) {
				return false;
			}
			state.result = UnsafeNumericCast<store_t>(state.result * 10 - digit);
		} else {
			if (DUCKDB_UNLIKELY(state.result > (NumericLimits<store_t>::Maximum() - digit) / 10)) {
				return false;
			}
			state.result = UnsafeNumericCast<store_t>(state.result * 10 + digit);
		}
		return true;
	}